

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O3

ObjTypeSpecFldInfo *
ObjTypeSpecFldInfo::CreateFrom
          (uint id,PolymorphicInlineCache *cache,uint cacheId,EntryPointInfo *entryPoint,
          FunctionBody *topFunctionBody,FunctionBody *functionBody,
          FieldAccessStatsPtr inlineCacheStats)

{
  char *addr;
  Type pIVar1;
  long *plVar2;
  RuntimeFunction *pRVar3;
  DynamicType *this;
  code *pcVar4;
  size_t size;
  FunctionBody *pFVar5;
  uint uVar6;
  TypeId typeId;
  bool bVar7;
  uint uVar8;
  PropertyId propertyId;
  BOOL BVar9;
  undefined4 *puVar10;
  DynamicProfileInfo *pDVar11;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ScriptContext *pSVar12;
  PropertyRecord *pPVar13;
  ulong uVar14;
  Recycler *pRVar15;
  FixedFieldInfo *dst;
  NativeEntryPointData *this_00;
  PolymorphicInlineCache *pPVar16;
  intptr_t iVar17;
  ObjTypeSpecPolymorphicInfo *pOVar18;
  void *pvVar19;
  RecyclerJITTypeHolder *types;
  JITType *this_01;
  EquivalentTypeSet *this_02;
  FunctionInfo *pFVar20;
  JITTypeHolder JVar21;
  uint uVar22;
  Type TVar23;
  uint16 count;
  DynamicType *dynamicType;
  Var pvVar24;
  size_t sVar25;
  short sVar26;
  ulong uVar27;
  byte bVar28;
  char cVar29;
  ulong uVar30;
  uint uVar31;
  ushort uVar32;
  undefined8 in_R11;
  uint16 i;
  PolymorphicInlineCache *pPVar33;
  ushort uVar34;
  uint16 polymorphicInfoCount;
  uint uVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  ulong *puVar39;
  Type *type;
  ulong uVar40;
  InlineCache *inlineCache;
  InlineCache *this_03;
  undefined1 local_428 [8];
  FixedFieldInfo localFixedFieldInfoArray [4];
  Type *localTypes [32];
  ObjTypeSpecPolymorphicInfo localPolymorphicInfo [32];
  undefined **local_120;
  JavascriptFunction *fixedFunctionObject;
  ulong local_110;
  char *local_108;
  DWORD local_100;
  Var local_f8;
  Var fixedProperty;
  ulong local_e8;
  DynamicObject *local_e0;
  uint local_d4;
  FunctionBody *local_d0;
  ulong local_c8;
  ulong local_c0;
  FixedFieldInfo *local_b8;
  ScriptContext *local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined8 local_98;
  PolymorphicInlineCache *local_90;
  ulong local_88;
  JitTransferData *local_80;
  Phases *local_78;
  undefined8 local_70;
  Recycler *local_68;
  undefined8 local_60;
  undefined4 *local_58;
  uint16 local_4a;
  undefined8 local_48;
  TypeId local_3c;
  DynamicProfileInfo *local_38;
  
  local_c0 = CONCAT44(local_c0._4_4_,cacheId);
  local_70 = functionBody;
  if ((topFunctionBody->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2d6,"(topFunctionBody->HasDynamicProfileInfo())",
                       "topFunctionBody->HasDynamicProfileInfo()");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
  }
  pDVar11 = Js::FunctionBody::GetAnyDynamicProfileInfo(topFunctionBody);
  if (cache->cloneForJitTimeUse == true) {
    bVar7 = Js::FunctionBody::PolyInliningUsingFixedMethodsAllowedByConfigFlags
                      (local_70,topFunctionBody);
    local_60 = CONCAT44(local_60._4_4_,(int)CONCAT71(extraout_var,bVar7));
  }
  else {
    local_60 = (ulong)local_60._4_4_ << 0x20;
  }
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  pFVar20 = (topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar20 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = pDVar11;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    pFVar20 = (topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    pDVar11 = local_38;
  }
  bVar7 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,EquivObjTypeSpecPhase,uVar8,pFVar20->functionId);
  if (bVar7) {
    if ((char)local_60 == '\0') {
      return (ObjTypeSpecFldInfo *)(DynamicProfileInfo *)0x0;
    }
  }
  else if (((char)local_60 == '\0') && (*(int *)&pDVar11->bits < 0)) {
    return (ObjTypeSpecFldInfo *)(DynamicProfileInfo *)0x0;
  }
  uVar32 = cache->size;
  local_d0 = topFunctionBody;
  if (uVar32 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2e3,"(cache->GetSize() < (65535))","cache->GetSize() < UINT16_MAX");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    uVar32 = cache->size;
  }
  pFVar5 = local_d0;
  uVar35 = (uint)uVar32;
  pIVar1 = cache->inlineCaches;
  local_90 = cache;
  if (local_d0 == local_70) {
    local_48 = (ObjTypeSpecPolymorphicInfo *)((ulong)local_48 & 0xffffffff00000000);
  }
  else {
    uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_d0);
    pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar20 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) goto LAB_00611532;
      *puVar10 = 0;
      pFVar20 = (local_d0->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar7 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,DepolymorphizeInlineesPhase,uVar8,pFVar20->functionId
                      );
    local_48 = (ObjTypeSpecPolymorphicInfo *)
               (CONCAT44(local_48._4_4_,(int)CONCAT71(extraout_var_00,bVar7)) ^ 1);
  }
  pFVar5 = local_d0;
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_d0);
  pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  local_d4 = id;
  if (pFVar20 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    pFVar20 = (local_d0->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    local_58 = puVar10;
  }
  else {
    local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  bVar7 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_0159c0e0,EquivObjTypeSpecPhase,uVar8,pFVar20->functionId);
  uVar30 = CONCAT71(extraout_var_01,bVar7) & 0xffffffff;
  local_3c = TypeIds_Limit;
  pPVar16 = (PolymorphicInlineCache *)CONCAT62((int6)((ulong)in_R11 >> 0x10),0xffff);
  uVar14 = 1;
  local_38 = (DynamicProfileInfo *)0x0;
  local_78 = (Phases *)&DAT_015a4e90;
  pPVar33 = (PolymorphicInlineCache *)0x0;
  local_68 = (Recycler *)CONCAT44(local_68._4_4_,(int)CONCAT71(extraout_var_01,bVar7));
  local_98 = (ulong)local_98._4_4_ << 0x20;
  local_a0 = 0;
  local_c8 = 0;
  local_a8 = 0;
  pvVar24 = (Var)0x0;
  uVar27 = 0;
  local_b0 = (ScriptContext *)0x0;
  local_e0 = (DynamicObject *)0x0;
  uVar40 = local_60 & 0xffffffff;
  local_80 = (JitTransferData *)CONCAT71(local_80._1_7_,(char)uVar30);
  local_b8 = (FixedFieldInfo *)CONCAT44(local_b8._4_4_,uVar35);
  uVar31 = (uint)local_48;
  while( true ) {
    uVar32 = (ushort)pPVar16;
    uVar6 = local_48._4_4_;
    if ((((((char)uVar30 == '\0') && (uVar14 == 0)) && ((uVar40 & 1) == 0)) && ((uVar31 & 1) == 0))
       || ((ushort)uVar35 <= (ushort)pPVar33)) break;
    uVar38 = (ulong)(((uint)pPVar33 & 0xffff) << 5);
    pSVar12 = *(ScriptContext **)((long)&pIVar1->u + uVar38);
    if (pSVar12 != (ScriptContext *)0x0) {
      puVar39 = (ulong *)((long)&pIVar1->u + uVar38);
      if (uVar32 == 0xffff) {
        if ((puVar39[2] & 1) == 0) {
          if (((ulong)pSVar12 & 1) == 0) {
            local_48 = (ObjTypeSpecPolymorphicInfo *)CONCAT44(local_48._4_4_,uVar31);
            fixedProperty = pvVar24;
            local_e8 = uVar27;
            if ((puVar39[1] & 1) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = local_58;
              *local_58 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                                 ,0x323,"(inlineCache.IsAccessor())","inlineCache.IsAccessor()");
              if (!bVar7) goto LAB_00611532;
              *puVar10 = 0;
            }
            pFVar5 = local_70;
            uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_70);
            pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
            if (pFVar20 == (FunctionInfo *)0x0) {
              local_60 = CONCAT44(local_60._4_4_,uVar8);
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = local_58;
              *local_58 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar7) goto LAB_00611532;
              *puVar10 = 0;
              pFVar20 = (local_70->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
              ;
              uVar8 = (uint)local_60;
            }
            bVar7 = Js::Phases::IsEnabled(local_78,FixAccessorPropsPhase,uVar8,pFVar20->functionId);
            if (bVar7) {
              local_68 = (Recycler *)((ulong)local_68 & 0xffffffff00000000);
              uVar14 = 0;
              pvVar24 = fixedProperty;
              uVar27 = local_e8;
            }
            else {
              uVar35 = (uint)puVar39[1];
              local_a0 = (ulong)CONCAT31((int3)(~uVar35 >> 8),(~uVar35 & 3) == 0);
              local_98 = CONCAT44(local_98._4_4_,CONCAT31((int3)(uVar35 >> 8),(byte)uVar35 >> 3));
              local_b0 = (ScriptContext *)*puVar39;
              uVar27 = puVar39[2];
              local_3c = *(TypeId *)(uVar27 & 0xfffffffffffffffb);
              pvVar24 = (Var)CONCAT71((int7)(uVar27 >> 8),(byte)uVar27 >> 2);
              uVar27 = (ulong)*(ushort *)((long)puVar39 + 10);
              local_c8 = CONCAT71((uint7)(uint3)(local_3c >> 8),1);
            }
            uVar40 = 0;
            uVar30 = (ulong)local_80 & 0xff;
            uVar31 = (uint)local_48;
            uVar35 = (uint)local_b8;
          }
          else if (((ulong)pSVar12 & 2) == 0) {
            uVar27 = puVar39[1];
            local_e0 = (DynamicObject *)puVar39[2];
            local_3c = *(TypeId *)(uVar27 & 0xfffffffffffffffb);
            pvVar24 = (Var)CONCAT71((int7)(uVar27 >> 8),(byte)uVar27 >> 2);
            local_a8 = CONCAT71((uint7)(uint3)(local_3c >> 8),1);
            uVar27 = (ulong)pSVar12 >> 0x10 & 0xffff;
          }
          else {
            local_68 = (Recycler *)((ulong)local_68 & 0xffffffff00000000);
            uVar31 = 0;
            uVar14 = 0;
            uVar40 = 0;
          }
        }
        else {
          local_3c = *(TypeId *)((ulong)pSVar12 & 0xfffffffffffffffb);
          uVar40 = 0;
          uVar27 = (ulong)*(ushort *)((long)puVar39 + 0x12);
          uVar31 = uVar31 & 0xff;
          if (puVar39[1] != 0) {
            uVar14 = uVar40;
            uVar31 = 0;
          }
          pvVar24 = (Var)(CONCAT71((int7)((ulong)pSVar12 >> 8),(byte)pSVar12 >> 2) & 0xffffffff);
        }
        iVar36 = (int)local_38;
        if (((char)uVar30 == '\0') ||
           (pPVar16 = (PolymorphicInlineCache *)CONCAT62((int6)((ulong)pPVar16 >> 0x10),0xffff),
           ((ulong)local_68 & 1) != 0)) {
          pPVar16 = pPVar33;
        }
      }
      else {
        sVar26 = (short)uVar27;
        bVar28 = (byte)pvVar24;
        if ((puVar39[2] & 1) == 0) {
          if (((ulong)pSVar12 & 1) == 0) {
            if ((sVar26 != *(short *)((long)puVar39 + 10)) ||
               (((uint)puVar39[2] >> 2 & 1) != (uint)(bVar28 & 1))) {
              uVar14 = 0;
            }
            if ((local_c8 & 1) != 0) {
              if ((((((~(uint)puVar39[1] & 3) == 0 ^ (byte)local_a0) & 1) == 0) &&
                  (((uint)puVar39[1] & 8) != 0)) && (((local_98 & 1) != 0 && (local_b0 == pSVar12)))
                 ) {
                pSVar12 = (ScriptContext *)puVar39[2];
                goto LAB_00610319;
              }
            }
            goto LAB_00610324;
          }
          if ((sVar26 != (short)((ulong)pSVar12 >> 0x10)) ||
             (((uint)puVar39[1] >> 2 & 1) != (uint)(bVar28 & 1))) {
            uVar14 = 0;
          }
          if (((((local_a8 & 1) == 0) || ((local_c8 & 1) != 0)) ||
              (local_e0 != (DynamicObject *)puVar39[2])) ||
             (local_3c != *(TypeId *)(puVar39[1] & 0xfffffffffffffffb))) {
            uVar31 = 0;
            uVar14 = 0;
          }
        }
        else {
          if ((sVar26 != *(short *)((long)puVar39 + 0x12)) ||
             (((uint)((ulong)pSVar12 >> 2) & 1) != (uint)(bVar28 & 1))) {
            uVar14 = 0;
          }
          if ((((local_a8 & 1) == 0) && ((local_c8 & 1) == 0)) && (puVar39[1] == 0)) {
LAB_00610319:
            if (local_3c != *(TypeId *)((ulong)pSVar12 & 0xfffffffffffffffb)) goto LAB_00610324;
          }
          else {
LAB_00610324:
            uVar31 = 0;
            uVar14 = 0;
          }
          uVar40 = 0;
        }
        iVar36 = (int)local_38;
      }
      local_38 = (DynamicProfileInfo *)(ulong)(iVar36 + 1);
    }
    pPVar33 = (PolymorphicInlineCache *)(ulong)((uint)pPVar33 + 1);
  }
  local_4a = (uint16)local_38;
  if (uVar32 == 0xffff) {
    if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
      inlineCacheStats->emptyPolyInlineCacheCount = inlineCacheStats->emptyPolyInlineCacheCount + 1;
    }
    return (ObjTypeSpecFldInfo *)(DynamicProfileInfo *)0x0;
  }
  uVar22 = (uint)(byte)local_68;
  bVar7 = local_90->ignoreForEquivalentObjTypeSpec != false;
  if (bVar7) {
    uVar22 = 0;
  }
  local_88 = CONCAT44(local_88._4_4_,uVar22);
  iVar36 = (int)uVar14;
  uVar14 = (ulong)local_48._4_4_;
  local_48 = (ObjTypeSpecPolymorphicInfo *)(uVar14 << 0x20);
  if (bVar7) {
    iVar36 = 0;
  }
  bVar28 = (byte)uVar40 & local_4a < 5;
  local_78 = (Phases *)CONCAT44(local_78._4_4_,iVar36);
  if (iVar36 == 0) {
    if ((uVar22 & 1) == 0) {
      if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
        inlineCacheStats->nonEquivPolyInlineCacheCount =
             inlineCacheStats->nonEquivPolyInlineCacheCount + 1;
      }
      local_90->ignoreForEquivalentObjTypeSpec = true;
      if (bVar28 == 0) {
        local_48 = (ObjTypeSpecPolymorphicInfo *)CONCAT44(uVar6,uVar31);
        if ((uVar31 & 1) == 0) {
          return (ObjTypeSpecFldInfo *)(DynamicProfileInfo *)0x0;
        }
      }
      else {
        local_48 = (ObjTypeSpecPolymorphicInfo *)CONCAT44(uVar6,uVar31);
      }
    }
    else {
      local_48 = (ObjTypeSpecPolymorphicInfo *)(uVar14 << 0x20);
    }
  }
  local_60 = CONCAT44(local_60._4_4_,(int)CONCAT71((int7)(uVar40 >> 8),bVar28));
  cVar29 = (char)uVar30;
  local_90 = pPVar16;
  if ((ushort)uVar35 <= uVar32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = local_58;
    *local_58 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38c,"(firstNonEmptyCacheIndex < polyCacheSize)",
                       "firstNonEmptyCacheIndex < polyCacheSize");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    cVar29 = (char)local_80;
  }
  iVar36 = (int)local_90;
  if (local_3c == TypeIds_Limit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = local_58;
    *local_58 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38d,"(typeId != Js::TypeIds_Limit)","typeId != Js::TypeIds_Limit");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    iVar36 = (int)local_90;
    cVar29 = (char)local_80;
  }
  if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
    inlineCacheStats->equivPolyInlineCacheCount = inlineCacheStats->equivPolyInlineCacheCount + 1;
  }
  if (cVar29 != '\0') {
    if ((((byte)local_78 ^ (byte)local_88) & 1) != 0) {
      uVar35 = iVar36 + 1;
    }
  }
  fixedProperty = pvVar24;
  local_e8 = uVar27;
  pSVar12 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_70);
  local_68 = pSVar12->recycler;
  memset(local_428,0,0x180);
  local_f8 = (Var)0x0;
  if ((((local_a8 & 1) != 0) || ((local_98 & 1) != 0)) &&
     ((((ulong)local_78 & 1) != 0 || ((local_88 & 1) != 0)))) {
    propertyId = Js::FunctionBody::GetPropertyIdFromCacheId(local_70,(uint)local_c0);
    pPVar13 = Js::ScriptContext::GetPropertyName(pSVar12,propertyId);
    if ((local_a8 & 1) == 0) {
      if ((local_98 & 1) != 0) {
        pRVar3 = (((local_b0->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).weakSetConstructor.ptr;
        (*(pRVar3->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x5b])
                  (pRVar3,pPVar13,&local_f8,4,(ulong)((byte)local_a0 & 1),pSVar12);
      }
    }
    else {
      plVar2 = *(long **)((local_e0->super_RecyclableObject).type.ptr + 1);
      (**(code **)(*plVar2 + 0x2d0))(plVar2,pPVar13,&local_f8,3,pSVar12);
    }
    FixedFieldInfo::PopulateFixedField((Type *)0x0,local_f8,(FixedFieldInfo *)local_428);
  }
  localTypes[0x1f] = (Type *)0x0;
  cVar29 = (char)local_80;
  uVar31 = (uint)local_60;
  local_b0 = pSVar12;
  if ((ushort)local_90 < (ushort)uVar35) {
    local_a0 = CONCAT71(local_a0._1_7_,(byte)local_78 | (byte)local_88);
    this_03 = (InlineCache *)((long)&pIVar1->u + (ulong)(((uint)local_90 & 0xffff) << 5));
    uVar35 = uVar35 - (uint)local_90;
    local_b8 = (FixedFieldInfo *)((ulong)local_b8 & 0xffffffff00000000);
    uVar32 = 0;
    do {
      uVar14 = *(ulong *)&this_03->u;
      if (uVar14 != 0) {
        if ((undefined1  [24])((undefined1  [24])this_03->u & (undefined1  [24])0x1) ==
            (undefined1  [24])0x0) {
          if ((uVar14 & 1) == 0) {
            uVar14 = *(ulong *)((long)&this_03->u + 0x10);
            type = (Type *)(uVar14 & 0xfffffffffffffffb);
            localTypes[(ulong)uVar32 - 1] = type;
            if (((ulong)local_48 & 1) != 0) {
              TVar23 = (this_03->u).accessor.slotIndex;
              goto LAB_006107ff;
            }
          }
          else {
            uVar27 = *(ulong *)((long)&this_03->u + 8);
            type = (Type *)(uVar27 & 0xfffffffffffffffb);
            localTypes[(ulong)uVar32 - 1] = type;
            if (((ulong)local_48 & 1) != 0) {
              pOVar18 = localPolymorphicInfo + ((ulong)uVar32 - 2);
              (pOVar18->m_data).slotIndex = (Type)(uVar14 >> 0x10);
              bVar28 = (byte)uVar27;
              goto LAB_00610835;
            }
          }
        }
        else {
          type = (Type *)(uVar14 & 0xfffffffffffffffb);
          localTypes[(ulong)uVar32 - 1] = type;
          if (((ulong)local_48 & 1) != 0) {
            TVar23 = (this_03->u).local.slotIndex;
LAB_006107ff:
            bVar28 = (byte)uVar14;
            pOVar18 = localPolymorphicInfo + ((ulong)uVar32 - 2);
            (pOVar18->m_data).slotIndex = TVar23;
LAB_00610835:
            (pOVar18->m_data).usesAuxSlot = bVar28 >> 2 & 1;
          }
        }
        if ((uVar31 & 1) != 0) {
          local_120 = (undefined **)0x0;
          Js::InlineCache::TryGetFixedMethodFromCache
                    (this_03,local_70,(uint)local_c0,(JavascriptFunction **)&stack0xfffffffffffffee0
                    );
          if (((JavascriptFunction *)local_120 == (JavascriptFunction *)0x0) ||
             ((((((JavascriptFunction *)local_120)->functionInfo).ptr)->functionBodyImpl).ptr ==
              (FunctionProxy *)0x0)) {
            if ((local_a0 & 1) == 0) {
              return (ObjTypeSpecFldInfo *)(DynamicProfileInfo *)0x0;
            }
            uVar32 = uVar32 + 1;
            uVar31 = 0;
            cVar29 = (char)local_80;
            goto LAB_006108c5;
          }
          FixedFieldInfo::PopulateFixedField
                    (type,local_120,(FixedFieldInfo *)(local_428 + (uint)uVar32 * 0x60));
          local_b8 = (FixedFieldInfo *)CONCAT44(local_b8._4_4_,(uint)local_b8 + 1);
          cVar29 = (char)local_80;
        }
        uVar32 = uVar32 + 1;
      }
LAB_006108c5:
      this_03 = this_03 + 1;
      uVar34 = (short)uVar35 - 1;
      uVar35 = (uint)uVar34;
    } while (uVar34 != 0);
    uVar35 = (uint)local_b8;
    puVar10 = local_58;
    if (((byte)local_c8 & (byte)uVar31 & 1 < (ushort)local_b8) == 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = local_58;
      *local_58 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x3fb,"(fixedFunctionCount <= 1)","fixedFunctionCount <= 1");
      if (!bVar7) goto LAB_00611532;
      *puVar10 = 0;
      cVar29 = (char)local_80;
    }
  }
  else {
    uVar35 = 0;
    uVar32 = 0;
    puVar10 = local_58;
  }
  if ((cVar29 != '\0') && ((((byte)local_78 ^ (byte)local_88) & 1) != 0)) {
    local_4a = 1;
    local_38 = (DynamicProfileInfo *)CONCAT62((uint6)(ushort)((ulong)local_78 >> 0x10),1);
  }
  if (uVar32 != (ushort)local_38) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x403,"(typeNumber == typeCount)","typeNumber == typeCount");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
  }
  uVar14 = (ulong)(uVar35 & 0xffff);
  local_60 = CONCAT44(local_60._4_4_,uVar31);
  if ((uVar31 & 1) == 0) {
    local_120 = &FixedFieldInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_110 = 1;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x411;
    pRVar15 = Memory::Recycler::TrackAllocInfo(local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
    BVar9 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar9 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar7) goto LAB_00611532;
      *puVar10 = 0;
    }
    dst = (FixedFieldInfo *)
          Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>(pRVar15,0x60)
    ;
    if (dst == (FixedFieldInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar7) goto LAB_00611532;
      *puVar10 = 0;
    }
    (dst->m_data).funcInfoAddr.ptr = (void *)0x0;
    (dst->m_data).environmentAddr.ptr = (void *)0x0;
    (dst->m_data).type.handler.struct_pad_1 = 0;
    (dst->m_data).type.handler.slotCapacity = 0;
    (dst->m_data).fieldValue.ptr = (void *)0x0;
    (dst->m_data).type.addr.ptr = (void *)0x0;
    (dst->m_data).type.handler.isObjectHeaderInlinedTypeHandler = '\0';
    (dst->m_data).type.handler.flags = '\0';
    (dst->m_data).type.handler.inlineSlotCapacity = 0;
    (dst->m_data).type.handler.offsetOfInlineSlots = 0;
    (dst->m_data).type.handler.struct_pad_0 = 0;
    (dst->m_data).type.entrypointAddr = 0;
    (dst->m_data).type.propertyCacheAddr.ptr = (void *)0x0;
    (dst->m_data).type.libAddr.ptr = (void *)0x0;
    (dst->m_data).type.protoAddr.ptr = (void *)0x0;
    (dst->m_data).valueType = 0;
    (dst->m_data).nextHasSameFixedField = '\0';
    (dst->m_data).isClassCtor = '\0';
    (dst->m_data).localFuncId = 0;
    (dst->m_data).type.exists = '\0';
    (dst->m_data).type.flags = '\0';
    (dst->m_data).type.isShared = '\0';
    (dst->m_data).type.struct_pad_0 = '\0';
    (dst->m_data).type.typeId = 0;
    sVar25 = 1;
  }
  else {
    local_120 = &FixedFieldInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x40b;
    local_110 = uVar14;
    pRVar15 = Memory::Recycler::TrackAllocInfo(local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
    sVar25 = uVar14;
    if ((short)uVar35 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar15,(TrackAllocData *)0x0);
      dst = (FixedFieldInfo *)&DAT_00000008;
    }
    else {
      BVar9 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00611532;
        *puVar10 = 0;
      }
      size = (ulong)((uVar35 & 0xffff) << 5) * 3;
      dst = (FixedFieldInfo *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (pRVar15,size);
      if (dst == (FixedFieldInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) goto LAB_00611532;
        *puVar10 = 0;
      }
      memset(dst,0,size - ((int)size - 0x60U) % 0x60);
    }
  }
  Memory::CopyArray<FixedFieldInfo,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            (dst,sVar25,(FixedFieldInfo *)local_428,sVar25);
  uVar35 = Js::FunctionBody::GetPropertyIdFromCacheId(local_70,(uint)local_c0);
  this_00 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
  local_c0 = (ulong)uVar35;
  pPVar16 = (PolymorphicInlineCache *)
            NativeEntryPointData::RegisterSharedPropertyGuard(this_00,uVar35,local_b0);
  local_70 = (FunctionBody *)CONCAT44(local_70._4_4_,(int)CONCAT71((int7)((ulong)pPVar16 >> 8),1));
  if ((local_60 & 1) == 0) {
    if ((((local_a8 & 1) == 0) && ((local_98 & 1) == 0)) ||
       ((((ulong)local_78 & 1) == 0 && ((local_88 & 1) == 0)))) {
      local_70 = (FunctionBody *)((ulong)local_70._4_4_ << 0x20);
    }
    else {
      iVar17 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)local_428);
      local_70 = (FunctionBody *)
                 CONCAT44(local_70._4_4_,(int)CONCAT71((int7)((ulong)iVar17 >> 8),iVar17 != 0));
    }
  }
  local_80 = Js::EntryPointInfo::GetJitTransferData(entryPoint);
  if (local_80 == (JitTransferData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x423,"(jitTransferData != nullptr)","jitTransferData != nullptr");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
  }
  bVar28 = (byte)local_78 | (byte)local_88;
  local_78 = (Phases *)CONCAT44(local_78._4_4_,CONCAT31((int3)((ulong)local_78 >> 8),bVar28));
  local_b8 = dst;
  local_a0 = uVar14;
  local_90 = pPVar16;
  if ((bVar28 & 1) == 0) {
    if (((ulong)local_48 & 1) != 0) goto LAB_00610d43;
    this_02 = (EquivalentTypeSet *)0x0;
    local_48 = (ObjTypeSpecPolymorphicInfo *)0x0;
    polymorphicInfoCount = 0;
  }
  else {
    if (((ulong)local_48 & 1) == 0) {
      uVar32 = (ushort)local_38;
      uVar14 = (ulong)local_38 & 0xffff;
      local_60 = 0;
      local_48 = (ObjTypeSpecPolymorphicInfo *)0x0;
      uVar27 = 0;
    }
    else {
LAB_00610d43:
      SortTypesAndPolymorphicInfo
                ((Type **)&localFixedFieldInfoArray[3].m_data.environmentAddr,
                 (ObjTypeSpecPolymorphicInfo *)(localTypes + 0x1f),&local_4a);
      uVar32 = local_4a;
      uVar14 = (ulong)local_4a;
      local_120 = &ObjTypeSpecPolymorphicInfo::typeinfo;
      fixedFunctionObject = (JavascriptFunction *)0x0;
      local_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
      ;
      local_100 = 0x430;
      local_110 = uVar14;
      pRVar15 = Memory::Recycler::TrackAllocInfo
                          (local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
      if (uVar14 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar15,(TrackAllocData *)0x0);
        pvVar19 = (void *)0x0;
        local_48 = (ObjTypeSpecPolymorphicInfo *)&DAT_00000008;
      }
      else {
        BVar9 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar9 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = local_58;
          *local_58 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar7) goto LAB_00611532;
          *puVar10 = 0;
        }
        pOVar18 = (ObjTypeSpecPolymorphicInfo *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                            (pRVar15,(ulong)((uint)uVar32 * 4));
        if (pOVar18 == (ObjTypeSpecPolymorphicInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = local_58;
          *local_58 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar7) goto LAB_00611532;
          *puVar10 = 0;
        }
        local_48 = pOVar18;
        pvVar19 = memset(pOVar18,0,(ulong)((uint)uVar32 * 4));
      }
      local_e8 = CONCAT62((int6)((ulong)pvVar19 >> 0x10),0xffff);
      local_60 = CONCAT71((int7)(local_e8 >> 8),1);
      uVar27 = (ulong)uVar32;
    }
    local_120 = &JITTypeHolderBase<Memory::Recycler>::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x433;
    local_110 = uVar14;
    pRVar15 = Memory::Recycler::TrackAllocInfo(local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
    if (uVar32 == 0) {
      count = 0;
      Memory::Recycler::ClearTrackAllocInfo(pRVar15,(TrackAllocData *)0x0);
      types = (RecyclerJITTypeHolder *)&DAT_00000008;
    }
    else {
      BVar9 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = local_58;
        *local_58 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00611532;
        *puVar10 = 0;
      }
      types = (RecyclerJITTypeHolder *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                        (pRVar15,(ulong)(uint)((int)uVar14 * 8));
      if (types == (RecyclerJITTypeHolder *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = local_58;
        *local_58 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) goto LAB_00611532;
        *puVar10 = 0;
      }
      uVar40 = 0;
      do {
        JITTypeHolderBase<Memory::Recycler>::JITTypeHolderBase
                  ((JITTypeHolderBase<Memory::Recycler> *)((long)&(types->t).ptr + uVar40));
        uVar40 = uVar40 + 8;
      } while ((uint)((int)uVar14 << 3) != uVar40);
      if (uVar32 == 0) {
        count = 0;
      }
      else {
        local_98 = uVar27;
        local_88 = (ulong)local_4a;
        local_38 = (DynamicProfileInfo *)(ulong)local_4a;
        lVar37 = 0;
        pDVar11 = (DynamicProfileInfo *)0x0;
        do {
          this = *(DynamicType **)
                  ((long)&localFixedFieldInfoArray[3].m_data.environmentAddr.ptr + lVar37);
          JitTransferData::AddJitTimeTypeRef(local_80,this,local_68);
          if ((((char)local_70 != '\0') &&
              (bVar7 = Js::DynamicType::Is((this->super_Type).typeId), bVar7)) &&
             (this->isLocked == false)) {
            Js::DynamicType::LockType(this);
          }
          local_120 = &JITType::typeinfo;
          fixedFunctionObject = (JavascriptFunction *)0x0;
          local_110 = 0xffffffffffffffff;
          local_108 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
          ;
          local_100 = 0x447;
          pRVar15 = Memory::Recycler::TrackAllocInfo
                              (local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
          this_01 = (JITType *)new<Memory::Recycler>(0x40,pRVar15,0x387914);
          JITType::JITType(this_01);
          addr = (char *)((long)&(types->t).ptr + lVar37);
          Memory::Recycler::WBSetBit(addr);
          *(JITType **)((long)&(types->t).ptr + lVar37) = this_01;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          JITType::BuildFromJsType
                    (*(Type **)((long)&localFixedFieldInfoArray[3].m_data.environmentAddr.ptr +
                               lVar37),*(JITType **)((long)&(types->t).ptr + lVar37));
          if ((char)local_60 != '\0') {
            local_48[(long)pDVar11].m_data =
                 localPolymorphicInfo[(long)((long)&pDVar11[-1].functionBody.ptr + 6)].m_data;
          }
          pDVar11 = (DynamicProfileInfo *)((long)&(pDVar11->dynamicProfileFunctionInfo).ptr + 1);
          lVar37 = lVar37 + 8;
        } while (pDVar11 < local_38);
        count = (uint16)local_88;
        uVar27 = local_98;
      }
    }
    polymorphicInfoCount = (uint16)uVar27;
    local_120 = &Js::EquivalentTypeSet::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_110 = 0xffffffffffffffff;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x450;
    pRVar15 = Memory::Recycler::TrackAllocInfo(local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
    this_02 = (EquivalentTypeSet *)new<Memory::Recycler>(0x10,pRVar15,0x387914);
    Js::EquivalentTypeSet::EquivalentTypeSet(this_02,types,count);
    if ((char)local_60 != '\0') {
      this_02->sortedAndDuplicatesRemoved = true;
    }
  }
  typeId = local_3c;
  bVar28 = (byte)local_78;
  local_120 = &typeinfo;
  fixedFunctionObject = (JavascriptFunction *)0x0;
  local_110 = 0xffffffffffffffff;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
  ;
  local_100 = 0x45a;
  pRVar15 = Memory::Recycler::TrackAllocInfo(local_68,(TrackAllocData *)&stack0xfffffffffffffee0);
  local_38 = (DynamicProfileInfo *)new<Memory::Recycler>(0x50,pRVar15,0x387914);
  local_68 = (Recycler *)(local_e8 & 0xffff);
  ObjTypeSpecFldInfo((ObjTypeSpecFldInfo *)local_38,local_d4,typeId,(JITType *)0x0,this_02,
                     (bool)((byte)fixedProperty & 1),(bool)((byte)local_a8 & 1),
                     (bool)((byte)local_c8 & 1),SUB81(local_70,0),SUB81(local_70,0),
                     (bool)((bVar28 ^ 1) & 1),true,(uint16)local_e8,(PropertyId)local_c0,local_e0,
                     (PropertyGuard *)local_90,(JITTimeConstructorCache *)0x0,local_b8,
                     (uint16)local_a0,polymorphicInfoCount,local_48);
  pFVar5 = local_d0;
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_d0);
  pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar20 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = local_58;
    *local_58 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar8,pFVar20->functionId);
  if (!bVar7) {
    uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar20 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = local_58;
      *local_58 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) goto LAB_00611532;
      *puVar10 = 0;
      pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar7 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,EquivObjTypeSpecPhase,uVar8,pFVar20->functionId);
    if (!bVar7) {
      return (ObjTypeSpecFldInfo *)local_38;
    }
  }
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
  pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar20 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = local_58;
    *local_58 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_00611532;
    *puVar10 = 0;
    pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar8,pFVar20->functionId);
  if (bVar7) {
    if (this_02 == (EquivalentTypeSet *)0x0) {
      return (ObjTypeSpecFldInfo *)local_38;
    }
  }
  else {
    uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar20 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = local_58;
      *local_58 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) {
LAB_00611532:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
      pFVar20 = (pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar7 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,EquivObjTypeSpecPhase,uVar8,pFVar20->functionId);
    if (this_02 == (EquivalentTypeSet *)0x0) {
      return (ObjTypeSpecFldInfo *)local_38;
    }
    if (!bVar7) {
      return (ObjTypeSpecFldInfo *)local_38;
    }
  }
  uVar14 = local_c0;
  pPVar13 = Js::ScriptContext::GetPropertyName(local_b0,(PropertyId)local_c0);
  Output::Print(L"Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: ",
                (ulong)local_d4,pPVar13 + 1,uVar14 & 0xffffffff,local_68);
  uVar35 = (uint)local_4a;
  if (1 < local_4a) {
    iVar36 = 0;
    do {
      JVar21 = Js::EquivalentTypeSet::GetType(this_02,(uint16)iVar36);
      Output::Print(L"0x%p, ",JVar21.t);
      iVar36 = iVar36 + 1;
    } while (uVar35 - 1 != iVar36);
  }
  JVar21 = Js::EquivalentTypeSet::GetType(this_02,(uint16)(uVar35 - 1));
  Output::Print(L"0x%p\n",JVar21.t);
  Output::Flush();
  return (ObjTypeSpecFldInfo *)local_38;
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfo::CreateFrom(uint id, Js::PolymorphicInlineCache* cache, uint cacheId,
    Js::EntryPointInfo *entryPoint, Js::FunctionBody* const topFunctionBody, Js::FunctionBody *const functionBody, Js::FieldAccessStatsPtr inlineCacheStats)
{

#ifdef FIELD_ACCESS_STATS
#define IncInlineCacheCount(counter) if (inlineCacheStats) { inlineCacheStats->counter++; }
#else
#define IncInlineCacheCount(counter)
#endif

    Assert(topFunctionBody->HasDynamicProfileInfo());
    auto profileData = topFunctionBody->GetAnyDynamicProfileInfo();

    bool gatherDataForInlining = cache->GetCloneForJitTimeUse() && functionBody->PolyInliningUsingFixedMethodsAllowedByConfigFlags(topFunctionBody);

    if (PHASE_OFF(Js::EquivObjTypeSpecPhase, topFunctionBody) || profileData->IsEquivalentObjTypeSpecDisabled())
    {
        if (!gatherDataForInlining)
        {
            return nullptr;
        }
    }

    Assert(cache->GetSize() < UINT16_MAX);
    Js::InlineCache* inlineCaches = cache->GetInlineCaches();
    Js::DynamicObject* prototypeObject = nullptr;
    Js::DynamicObject* accessorOwnerObject = nullptr;
    Js::TypeId typeId = Js::TypeIds_Limit;
    uint16 polyCacheSize = (uint16)cache->GetSize();
    uint16 firstNonEmptyCacheIndex = UINT16_MAX;
    uint16 slotIndex = 0;
    bool areEquivalent = true;
    bool canDepolymorphize = topFunctionBody != functionBody && !PHASE_OFF(Js::DepolymorphizeInlineesPhase, topFunctionBody);
    bool usesAuxSlot = false;
    bool isProto = false;
    bool isAccessor = false;
    bool isGetterAccessor = false;
    bool isAccessorOnProto = false;

    bool stress = PHASE_STRESS(Js::EquivObjTypeSpecPhase, topFunctionBody);
    bool areStressEquivalent = stress;

    uint16 typeCount = 0;
    for (uint16 i = 0; (areEquivalent || stress || gatherDataForInlining || canDepolymorphize) && i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (firstNonEmptyCacheIndex == UINT16_MAX)
        {
            if (inlineCache.IsLocal())
            {
                typeId = TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId();
                usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.local.type);
                slotIndex = inlineCache.u.local.slotIndex;
                // We don't support equivalent object type spec for adding properties.
                if (inlineCache.u.local.typeWithoutProperty != nullptr)
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            // Missing properties cannot be treated as equivalent, because for objects with SDTH or DTH, we don't change the object's type
            // when we add a property.  We also don't invalidate proto inline caches (and guards) unless the property being added exists on the proto chain.
            // Missing properties by definition do not exist on the proto chain, so in the end we could have an EquivalentObjTypeSpec cache hit on a
            // property that once was missing, but has since been added. (See OS Bugs 280582).
            else if (inlineCache.IsProto())
            {
                if(!inlineCache.u.proto.isMissing)
                {
                    isProto = true;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.proto.type);
                    slotIndex = inlineCache.u.proto.slotIndex;
                    prototypeObject = inlineCache.u.proto.prototypeObject;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                    canDepolymorphize = false;
                    gatherDataForInlining = false;
                }
            }
            else
            {
                AssertOrFailFast(inlineCache.IsAccessor());
                if (!PHASE_OFF(Js::FixAccessorPropsPhase, functionBody))
                {
                    isAccessor = true;
                    isGetterAccessor = inlineCache.IsGetterAccessor();
                    isAccessorOnProto = inlineCache.u.accessor.isOnProto;
                    accessorOwnerObject = inlineCache.u.accessor.object;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.accessor.type);
                    slotIndex = inlineCache.u.accessor.slotIndex;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                }
                gatherDataForInlining = false;
            }

            // If we're stressing equivalent object type spec then let's keep trying to find a cache that we could use.
            if (!stress || areStressEquivalent)
            {
                firstNonEmptyCacheIndex = i;
            }
        }
        else
        {
            if (inlineCache.IsLocal())
            {
                if (slotIndex != inlineCache.u.local.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.local.type))
                {
                    areEquivalent = false;
                }
                if (isProto || isAccessor || inlineCache.u.local.typeWithoutProperty != nullptr || typeId != TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            else if (inlineCache.IsProto())
            {
                if (slotIndex != inlineCache.u.proto.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.proto.type))
                {
                    areEquivalent = false;
                }
                if (!isProto || isAccessor || prototypeObject != inlineCache.u.proto.prototypeObject || typeId != TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
            }
            else
            {
                // Supporting equivalent obj type spec only for those polymorphic accessor property operations for which
                // 1. the property is on the same prototype, and
                // 2. the types are equivalent.
                //
                // This is done to keep the equivalence check helper as-is
                if (slotIndex != inlineCache.u.accessor.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.accessor.type))
                {
                    areEquivalent = false;
                }
                if (!isAccessor || isGetterAccessor != inlineCache.IsGetterAccessor() || !isAccessorOnProto || !inlineCache.u.accessor.isOnProto ||
                    accessorOwnerObject != inlineCache.u.accessor.object || typeId != TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
        }
        typeCount++;
    }

    if (firstNonEmptyCacheIndex == UINT16_MAX)
    {
        IncInlineCacheCount(emptyPolyInlineCacheCount);
        return nullptr;
    }

    if (cache->GetIgnoreForEquivalentObjTypeSpec())
    {
        areEquivalent = areStressEquivalent = false;
    }

#if ENABLE_FIXED_FIELDS
    gatherDataForInlining = gatherDataForInlining && (typeCount <= 4); // Only support 4-way (max) polymorphic inlining
#else
    gatherDataForInlining = false;
#endif

    bool depolymorphize = false;
    if (!areEquivalent && !areStressEquivalent)
    {
        IncInlineCacheCount(nonEquivPolyInlineCacheCount);
        cache->SetIgnoreForEquivalentObjTypeSpec(true);
        // Only do depolymorphication bookkeeping if we're in an inlinee and types are not equivalent
        depolymorphize = canDepolymorphize;
        if (!gatherDataForInlining && !depolymorphize)
        {
            return nullptr;
        }
    }

    Assert(firstNonEmptyCacheIndex < polyCacheSize);
    Assert(typeId != Js::TypeIds_Limit);
    IncInlineCacheCount(equivPolyInlineCacheCount);

    // If we're stressing equivalent object type spec and the types are not equivalent, let's grab the first one only.
    if (stress && (areEquivalent != areStressEquivalent))
    {
        polyCacheSize = firstNonEmptyCacheIndex + 1;
    }

    Js::ScriptContext* scriptContext = functionBody->GetScriptContext();
    Recycler* recycler = scriptContext->GetRecycler();

    uint16 fixedFunctionCount = 0;

    // Need to create a local array here and not allocate one from the recycler,
    // as the allocation may trigger a GC which can clear the inline caches.
    FixedFieldInfo localFixedFieldInfoArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

#if ENABLE_FIXED_FIELDS
    // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
    // Since all types in the polymorphic cache share the same prototype, it's enough to grab the fixed function from the prototype object.
    Js::Var fixedProperty = nullptr;
    if ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent))
    {
        const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(cacheId));
        if (isProto)
        {
            prototypeObject->GetDynamicType()->GetTypeHandler()->TryUseFixedProperty(propertyRecord, &fixedProperty, (Js::FixedPropertyKind)(Js::FixedPropertyKind::FixedMethodProperty | Js::FixedPropertyKind::FixedDataProperty), scriptContext);
        }
        else if (isAccessorOnProto)
        {
            accessorOwnerObject->GetDynamicType()->GetTypeHandler()->TryUseFixedAccessor(propertyRecord, &fixedProperty, Js::FixedPropertyKind::FixedAccessorProperty, isGetterAccessor, scriptContext);
        }

        FixedFieldInfo::PopulateFixedField(nullptr, fixedProperty, &localFixedFieldInfoArray[0]);

        // TODO (ObjTypeSpec): Enable constructor caches on equivalent polymorphic field loads with fixed functions.
    }
#endif
    // Let's get the types.
    Js::Type* localTypes[MaxPolymorphicInlineCacheSize];
    ObjTypeSpecPolymorphicInfo localPolymorphicInfo[MaxPolymorphicInlineCacheSize];

    uint16 typeNumber = 0;
    for (uint16 i = firstNonEmptyCacheIndex; i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (inlineCache.IsLocal())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.local.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.local.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.local.type));
            }
        }
        else if (inlineCache.IsProto())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.proto.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.proto.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.proto.type));
            }
        }
        else
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.accessor.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.accessor.type));
            }
        }

#if ENABLE_FIXED_FIELDS
        if (gatherDataForInlining)
        {
            Js::JavascriptFunction* fixedFunctionObject = nullptr;
            inlineCache.TryGetFixedMethodFromCache(functionBody, cacheId, &fixedFunctionObject);
            if (!fixedFunctionObject || !fixedFunctionObject->GetFunctionInfo()->HasBody())
            {
                if (!(areEquivalent || areStressEquivalent))
                {
                    // If we reach here only because we are gathering data for inlining, and one of the Inline Caches doesn't have a fixedfunction object, return.
                    return nullptr;
                }
                else
                {
                    // If one of the inline caches doesn't have a fixed function object, abort gathering inlining data.
                    gatherDataForInlining = false;
                    typeNumber++;
                    continue;
                }
            }

            // We got a fixed function object from the cache.

            FixedFieldInfo::PopulateFixedField(localTypes[typeNumber], fixedFunctionObject, &localFixedFieldInfoArray[typeNumber]);

            fixedFunctionCount++;
        }
#endif
        typeNumber++;
    }

    if (isAccessor && gatherDataForInlining)
    {
        Assert(fixedFunctionCount <= 1);
    }

    if (stress && (areEquivalent != areStressEquivalent))
    {
        typeCount = 1;
    }

    AnalysisAssert(typeNumber == typeCount);

    // Now that we've copied all material info into local variables, we can start allocating without fear
    // that a garbage collection will clear any of the live inline caches.

    FixedFieldInfo* fixedFieldInfoArray;
    if (gatherDataForInlining)
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, fixedFunctionCount);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(
            fixedFieldInfoArray, fixedFunctionCount, localFixedFieldInfoArray, fixedFunctionCount);
    }
    else
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, 1);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(fixedFieldInfoArray, 1, localFixedFieldInfoArray, 1);
    }

    Js::PropertyId propertyId = functionBody->GetPropertyIdFromCacheId(cacheId);
    Js::PropertyGuard* propertyGuard = entryPoint->GetNativeEntryPointData()->RegisterSharedPropertyGuard(propertyId, scriptContext);

    // For polymorphic, non-equivalent objTypeSpecFldInfo's, hasFixedValue is true only if each of the inline caches has a fixed function for the given cacheId, or
    // in the case of an accessor cache, only if the there is only one version of the accessor.
    bool hasFixedValue = gatherDataForInlining ||
        ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent) && localFixedFieldInfoArray[0].GetFieldValue());

    bool doesntHaveEquivalence = !(areEquivalent || areStressEquivalent);

    Js::EquivalentTypeSet* typeSet = nullptr;
    ObjTypeSpecPolymorphicInfo * polymorphicInfoArray = nullptr;
    uint16 polymorphicInfoCount = 0;
    auto jitTransferData = entryPoint->GetJitTransferData();
    Assert(jitTransferData != nullptr);
    if (areEquivalent || areStressEquivalent || depolymorphize)
    {
        if (depolymorphize)
        {
            // Because we require the ordering of the polymorphic info to match the equivalent type set, and because there are places in the code
            // where the equivalent type set gets sorted without touching the polymorphic info, and may be more of them in future, just sort
            // them both now before anyone can use them.
            SortTypesAndPolymorphicInfo(localTypes, localPolymorphicInfo, &typeCount);

            // We don't have a single known slot index. We have one per type in the set. GlobOpt will sort out which one to use.
            slotIndex = Js::Constants::NoSlot;
            polymorphicInfoCount = typeCount;
            polymorphicInfoArray = RecyclerNewArrayLeaf(recycler, ObjTypeSpecPolymorphicInfo, typeCount);
        }

        RecyclerJITTypeHolder* types = RecyclerNewArray(recycler, RecyclerJITTypeHolder, typeCount);

        for (uint16 i = 0; i < typeCount; i++)
        {
            jitTransferData->AddJitTimeTypeRef(localTypes[i], recycler);
            if (hasFixedValue)
            {
                // Fixed field checks allow us to assume a specific type ID, but the assumption is only
                // valid if we lock the type. Otherwise, the type ID may change out from under us without
                // evolving the type.
                if (Js::DynamicType::Is(localTypes[i]))
                {
                    Js::DynamicType *dynamicType = static_cast<Js::DynamicType*>(localTypes[i]);
                    if (!dynamicType->GetIsLocked())
                    {
                        dynamicType->LockType();
                    }
                }
            }
            // TODO: OOP JIT, consider putting these inline
            types[i].t = RecyclerNew(recycler, JITType);
            __analysis_assume(localTypes[i] != nullptr);
            JITType::BuildFromJsType(localTypes[i], types[i].t);

            if (depolymorphize)
            {
                polymorphicInfoArray[i] = localPolymorphicInfo[i];
            }
        }
        typeSet = RecyclerNew(recycler, Js::EquivalentTypeSet, types, typeCount);
        if (depolymorphize)
        {
            // We sorted the set above.
            typeSet->SetSortedAndDuplicatesRemoved(true);
        }
    }

    ObjTypeSpecFldInfo* info = RecyclerNew(recycler, ObjTypeSpecFldInfo,
        id, typeId, nullptr, typeSet, usesAuxSlot, isProto, isAccessor, hasFixedValue, hasFixedValue, doesntHaveEquivalence, true, slotIndex, propertyId,
        prototypeObject, propertyGuard, nullptr, fixedFieldInfoArray, fixedFunctionCount, polymorphicInfoCount, polymorphicInfoArray);

    if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
    {
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            if (typeSet)
            {
                const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
                Output::Print(_u("Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: "),
                    id, propertyRecord->GetBuffer(), propertyId, slotIndex);
                for (uint16 ti = 0; ti < typeCount - 1; ti++)
                {
                    Output::Print(_u("0x%p, "), typeSet->GetType(ti));
                }
                Output::Print(_u("0x%p\n"), typeSet->GetType(typeCount - 1));
                Output::Flush();
            }
        }
    }

    return info;

#undef IncInlineCacheCount
}